

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::x86::X86RAPass::emitPreCall(X86RAPass *this,InvokeNode *invokeNode)

{
  bool bVar1;
  Error EVar2;
  BaseEmitter *this_00;
  uint8_t *puVar3;
  long in_RSI;
  long in_RDI;
  Error _err_2;
  Xmm src;
  Gp dst;
  FuncValue *arg_1;
  uint32_t valueIndex_1;
  FuncValuePack *argPack_1;
  uint32_t argIndex_1;
  Error _err_1;
  Error _err;
  FuncValue *arg;
  uint32_t valueIndex;
  FuncValuePack *argPack;
  uint32_t argIndex;
  uint32_t n;
  uint32_t argCount;
  FuncDetail *fd;
  Operand_ *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  CallConv *in_stack_fffffffffffffbe8;
  undefined4 local_3e0;
  uint local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  uint uStack_3cc;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  ulong local_3c0;
  undefined8 local_3b8;
  BaseEmitter *local_3b0;
  uint local_3a4;
  FuncValuePack *local_3a0;
  uint local_394;
  undefined4 local_390;
  undefined4 local_38c;
  uint local_388;
  undefined4 local_384;
  FuncValue *local_378;
  uint local_36c;
  FuncValuePack *local_368;
  uint local_35c;
  uint local_358;
  uint local_354;
  long local_350;
  BaseEmitter *local_310;
  FuncValue *local_308;
  BaseEmitter *local_300;
  FuncValue *local_2f8;
  undefined1 local_2ea;
  undefined1 local_2e9;
  BaseEmitter *local_2e8;
  FuncValue *local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  uint *local_2c8;
  undefined4 *local_2c0;
  BaseEmitter *local_2b8;
  undefined1 local_2aa;
  undefined1 local_2a9;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  uint local_25c;
  undefined4 *local_258;
  undefined4 *local_250;
  ulong *local_248;
  uint local_23c;
  undefined4 *local_238;
  undefined4 *local_230;
  ulong *local_228;
  undefined4 local_21c;
  CallConv *local_218;
  undefined4 local_210;
  undefined4 local_20c;
  long local_200;
  undefined4 local_1f4;
  FuncValue *local_1f0;
  undefined4 local_1e4;
  BaseEmitter *local_1e0;
  undefined1 local_1d1;
  undefined8 local_1d0;
  OperandSignature *local_1c8;
  OperandSignature *local_1c0;
  undefined1 local_1b1;
  undefined8 local_1b0;
  OperandSignature *local_1a8;
  OperandSignature *local_1a0;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  uint local_188;
  undefined4 local_184;
  undefined4 *local_180;
  undefined4 *local_178;
  undefined4 *local_170;
  undefined4 *local_168;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  ulong local_150;
  ulong local_148;
  long local_140;
  byte *local_130;
  byte local_121;
  undefined4 local_120;
  uint local_11c;
  undefined4 *local_118;
  undefined4 *local_110;
  ulong *local_108;
  undefined4 *local_100;
  ulong *local_f8;
  undefined4 local_f0;
  uint local_ec;
  undefined4 *local_e8;
  uint local_dc;
  undefined4 *local_d8;
  undefined4 *local_d0;
  uint local_c4;
  undefined4 *local_c0;
  undefined4 *local_b8;
  uint local_ac;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 local_94;
  undefined4 local_90;
  uint local_8c;
  undefined4 *local_88;
  undefined4 *local_80;
  uint local_74;
  undefined4 *local_70;
  undefined4 *local_68;
  uint local_5c;
  undefined4 *local_58;
  undefined4 *local_50;
  uint local_44;
  undefined4 *local_40;
  undefined4 *local_38;
  undefined4 local_2c;
  undefined4 local_28;
  uint local_24;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  ulong *local_8;
  
  local_288 = in_RSI + 0x80;
  if (*(char *)(in_RSI + 0xf5) != -1) {
    local_280 = *(long *)(in_RDI + 8);
    local_130 = (byte *)(local_280 + 0x48);
    local_121 = *local_130;
    if ((local_121 & 1) == 0) {
      local_350 = in_RSI + 0x80;
      local_200 = in_RSI + 0x80;
      local_354 = (uint)*(byte *)(in_RSI + 0xf4);
      local_270 = in_RSI + 0x80;
      local_268 = local_270;
      local_140 = local_280;
      if (*(char *)(in_RSI + 0x81) == ' ') {
        local_358 = 0;
        for (local_35c = 0; local_35c < local_354; local_35c = local_35c + 1) {
          local_368 = FuncDetail::argPack((FuncDetail *)
                                          CONCAT44(in_stack_fffffffffffffbe4,
                                                   in_stack_fffffffffffffbe0),
                                          (size_t)in_stack_fffffffffffffbd8);
          local_36c = 0;
          while ((local_36c < 4 &&
                 (local_378 = FuncValuePack::operator[]
                                        ((FuncValuePack *)
                                         CONCAT44(in_stack_fffffffffffffbe4,
                                                  in_stack_fffffffffffffbe0),
                                         (size_t)in_stack_fffffffffffffbd8), local_308 = local_378,
                 local_378->_data != 0))) {
            local_1f4 = 0x100;
            local_2f8 = local_378;
            local_1f0 = local_378;
            bVar1 = Support::test<unsigned_int,unsigned_int>(local_378->_data,0x100);
            if (bVar1) {
              local_2e0 = local_378;
              local_2e9 = (undefined1)(local_378->_data >> 0x18);
              local_2aa = 1;
              local_1d0 = 0x1fe0d8;
              local_1d1 = local_2e9;
              local_1c8 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                          operator[]<asmjit::v1_14::RegType>
                                    ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                     CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                     (RegType *)in_stack_fffffffffffffbd8);
              local_1c0 = local_1c8;
              if (((byte)(local_1c8->_bits >> 8) & 0xf) == 1) {
                local_358 = local_358 + 1;
              }
            }
            local_36c = local_36c + 1;
          }
        }
        if (local_358 == 0) {
          EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::xor_
                            ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)
                             in_stack_fffffffffffffbe8,
                             (Gp *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             (Gp *)in_stack_fffffffffffffbd8);
        }
        else {
          local_2c0 = &local_390;
          local_2c8 = &local_358;
          local_2cc = 0;
          local_194 = 4;
          local_190 = 4;
          local_2d4 = 4;
          local_158 = 0;
          local_2d8 = 0;
          local_168 = &local_2d4;
          local_170 = &local_2d8;
          local_2d0 = 4;
          local_188 = local_358;
          local_150 = (ulong)local_358;
          local_148 = (ulong)local_358;
          local_180 = &local_2d0;
          local_184 = 0;
          local_18c = 0;
          local_390 = 4;
          local_38c = 0;
          local_388 = local_358;
          local_384 = 0;
          local_178 = local_2c0;
          local_15c = local_2d0;
          local_154 = local_2d8;
          EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::mov
                            ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)
                             in_stack_fffffffffffffbe8,
                             (Gp *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             (Imm *)in_stack_fffffffffffffbd8);
        }
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      else {
        if (*(char *)(in_RSI + 0x81) != '!') {
          EVar2 = DebugUtils::errored(3);
          return EVar2;
        }
        for (local_394 = 0; local_394 < local_354; local_394 = local_394 + 1) {
          local_3a0 = FuncDetail::argPack((FuncDetail *)
                                          CONCAT44(in_stack_fffffffffffffbe4,
                                                   in_stack_fffffffffffffbe0),
                                          (size_t)in_stack_fffffffffffffbd8);
          local_3a4 = 0;
          while ((local_3a4 < 4 &&
                 (this_00 = (BaseEmitter *)
                            FuncValuePack::operator[]
                                      ((FuncValuePack *)
                                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                                       ,(size_t)in_stack_fffffffffffffbd8), local_3b0 = this_00,
                 local_310 = this_00, *(uint32_t *)&this_00->_vptr_BaseEmitter != 0))) {
            local_1e4 = 0x100;
            local_300 = this_00;
            local_1e0 = this_00;
            bVar1 = Support::test<unsigned_int,unsigned_int>
                              (*(uint *)&this_00->_vptr_BaseEmitter,0x100);
            if (bVar1) {
              local_2e8 = local_3b0;
              local_2ea = (undefined1)(*(uint32_t *)&local_3b0->_vptr_BaseEmitter >> 0x18);
              local_2a9 = 1;
              local_1b0 = 0x1fe0d8;
              local_1b1 = local_2ea;
              local_1a8 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                          operator[]<asmjit::v1_14::RegType>
                                    ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                     CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                     (RegType *)in_stack_fffffffffffffbd8);
              local_1a0 = local_1a8;
              if (((byte)(local_1a8->_bits >> 8) & 0xf) == 1) {
                local_278 = local_350;
                puVar3 = CallConv::passedOrder
                                   (in_stack_fffffffffffffbe8,
                                    (RegGroup)((uint)in_stack_fffffffffffffbe4 >> 0x18));
                local_258 = &local_3d0;
                local_25c = (uint)puVar3[local_394];
                local_118 = &local_3d0;
                local_120 = 0x8000039;
                local_70 = &local_120;
                local_28 = 0;
                local_2c = 0;
                local_3d0 = 0x8000039;
                local_3c8 = 0;
                uStack_3c4 = 0;
                local_248 = &local_3c0;
                local_250 = &local_3d0;
                local_3c0 = (ulong)CONCAT14(puVar3[local_394],0x8000039);
                local_3b8 = 0;
                local_2b8 = local_3b0;
                local_23c = (*(uint *)&local_3b0->_vptr_BaseEmitter & 0xff0000) >> 0x10;
                local_238 = &local_3e0;
                local_e8 = &local_3e0;
                local_f0 = 0x10000161;
                local_d8 = &local_f0;
                local_90 = 0;
                local_94 = 0;
                local_3e0 = 0x10000161;
                local_3d8 = 0;
                local_3d4 = 0;
                in_stack_fffffffffffffbe8 = *(CallConv **)(in_RDI + 8);
                local_20c = 0x1d3;
                local_210 = 0x4c0;
                if ((*(byte *)(in_RDI + 0x4c0) & 1) == 0) {
                  in_stack_fffffffffffffbe4 = 0x1d3;
                }
                else {
                  in_stack_fffffffffffffbe4 = 0x4c0;
                }
                local_228 = &local_3c0;
                local_230 = &local_3e0;
                local_21c = in_stack_fffffffffffffbe4;
                local_218 = in_stack_fffffffffffffbe8;
                local_11c = local_25c;
                local_110 = local_250;
                local_108 = local_248;
                local_100 = local_250;
                local_f8 = local_248;
                local_ec = local_23c;
                local_dc = local_23c;
                local_d0 = local_e8;
                local_c4 = local_23c;
                local_c0 = local_d8;
                local_b8 = local_e8;
                local_ac = local_23c;
                local_a8 = local_d8;
                local_a0 = local_e8;
                local_8c = local_23c;
                local_88 = local_d8;
                local_80 = local_e8;
                local_74 = local_25c;
                local_68 = local_118;
                local_5c = local_25c;
                local_58 = local_70;
                local_50 = local_118;
                local_44 = local_25c;
                local_40 = local_70;
                local_38 = local_118;
                local_24 = local_25c;
                local_20 = local_70;
                local_18 = local_118;
                local_10 = local_230;
                local_8 = local_228;
                local_3dc = local_23c;
                uStack_3cc = local_25c;
                EVar2 = BaseEmitter::_emitI(this_00,(InstId)((ulong)in_stack_fffffffffffffbe8 >>
                                                            0x20),
                                            (Operand_ *)
                                            CONCAT44(in_stack_fffffffffffffbe4,
                                                     in_stack_fffffffffffffbe0),
                                            in_stack_fffffffffffffbd8);
                if (EVar2 != 0) {
                  return EVar2;
                }
                in_stack_fffffffffffffbe0 = 0;
              }
            }
            local_3a4 = local_3a4 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

Error X86RAPass::emitPreCall(InvokeNode* invokeNode) noexcept {
  if (invokeNode->detail().hasVarArgs() && cc()->is64Bit()) {
    const FuncDetail& fd = invokeNode->detail();
    uint32_t argCount = invokeNode->argCount();

    switch (invokeNode->detail().callConv().id()) {
      case CallConvId::kX64SystemV: {
        // AL register contains the number of arguments passed in XMM register(s).
        uint32_t n = 0;
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec)
              n++;
          }
        }

        if (!n)
          ASMJIT_PROPAGATE(cc()->xor_(eax, eax));
        else
          ASMJIT_PROPAGATE(cc()->mov(eax, n));
        break;
      }

      case CallConvId::kX64Windows: {
        // Each double-precision argument passed in XMM must be also passed in GP.
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec) {
              Gp dst = gpq(fd.callConv().passedOrder(RegGroup::kGp)[argIndex]);
              Xmm src = xmm(arg.regId());
              ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovq, Inst::kIdVmovq), dst, src));
            }
          }
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }
  }

  return kErrorOk;
}